

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O0

void __thiscall
raft_functional_common::TestSm::create_snapshot(TestSm *this,snapshot *s,handler_type *when_done)

{
  function<void_(bool_&,_std::shared_ptr<std::exception>_&)> *in_RDI;
  bool ret;
  ptr<std::exception> except;
  ptr<buffer> snp_buf;
  lock_guard<std::mutex> ll;
  mutex_type *in_stack_ffffffffffffff78;
  __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff80;
  shared_ptr<nuraft::snapshot> *this_00;
  bool *__args;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  bool local_60 [16];
  shared_ptr<nuraft::snapshot> local_50;
  snapshot *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  nuraft::snapshot::serialize(in_stack_ffffffffffffffc8);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_ffffffffffffff80);
  nuraft::snapshot::deserialize
            ((buffer *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  this_00 = &local_50;
  std::shared_ptr<nuraft::snapshot>::operator=
            (this_00,(shared_ptr<nuraft::snapshot> *)in_stack_ffffffffffffff78);
  std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x1a6686);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1a6690);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1a669a);
  __args = local_60;
  std::shared_ptr<std::exception>::shared_ptr
            ((shared_ptr<std::exception> *)this_00,in_stack_ffffffffffffff78);
  std::function<void_(bool_&,_std::shared_ptr<std::exception>_&)>::operator()
            (in_RDI,__args,(shared_ptr<std::exception> *)this_00);
  std::shared_ptr<std::exception>::~shared_ptr((shared_ptr<std::exception> *)0x1a66d2);
  return;
}

Assistant:

void create_snapshot(snapshot& s,
                         async_result<bool>::handler_type& when_done)
    {
        {   std::lock_guard<std::mutex> ll(lastSnapshotLock);
            // NOTE: We only handle logical snapshot.
            ptr<buffer> snp_buf = s.serialize();
            lastSnapshot = snapshot::deserialize(*snp_buf);
        }
        ptr<std::exception> except(nullptr);
        bool ret = true;
        when_done(ret, except);
    }